

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YPSpur_md_isfreeze(YPSpur *spur)

{
  int iVar1;
  int ret;
  int len;
  YPSpur_msg msg;
  YPSpur *spur_local;
  
  _ret = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x202;
  msg.pid._4_4_ = 0;
  msg.data[3] = (double)spur;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)&ret);
  if (iVar1 < 0) {
    *(undefined4 *)((long)msg.data[3] + 0x234) = 1;
    spur_local._4_4_ = -1;
  }
  else {
    iVar1 = (**(code **)((long)msg.data[3] + 0x220))(msg.data[3],&ret);
    if (iVar1 < 0) {
      *(undefined4 *)((long)msg.data[3] + 0x234) = 1;
      spur_local._4_4_ = -1;
    }
    else {
      spur_local._4_4_ = (int)(double)msg._16_8_;
    }
  }
  return spur_local._4_4_;
}

Assistant:

int YPSpur_md_isfreeze(YPSpur* spur)
{
  YPSpur_msg msg;
  int len;
  int ret;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_ISFREEZE;
  msg.cs = 0;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  ret = (int)msg.data[0];
  return ret;
}